

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O1

void __thiscall glcts::GeometryShaderAdjacencyTests::deinit(GeometryShaderAdjacencyTests *this)

{
  pointer ppAVar1;
  pointer ppAVar2;
  
  ppAVar1 = (this->m_tests_data).
            super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppAVar2 = (this->m_tests_data).
                 super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppAVar2 != ppAVar1;
      ppAVar2 = ppAVar2 + 1) {
    if (*ppAVar2 != (AdjacencyTestData *)0x0) {
      (*(*ppAVar2)->_vptr_AdjacencyTestData[1])();
    }
    *ppAVar2 = (AdjacencyTestData *)0x0;
    ppAVar1 = (this->m_tests_data).
              super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  ppAVar2 = (this->m_tests_data).
            super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppAVar1 != ppAVar2) {
    (this->m_tests_data).
    super__Vector_base<glcts::AdjacencyTestData_*,_std::allocator<glcts::AdjacencyTestData_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppAVar2;
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::deinit(void)
{
	for (std::vector<AdjacencyTestData*>::iterator it = m_tests_data.begin(); it != m_tests_data.end(); ++it)
	{
		delete *it;
		*it = NULL;
	}

	m_tests_data.clear();

	/* Call base class' deinit() function. */
	glcts::TestCaseGroupBase::deinit();
}